

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O0

void __thiscall Result::showyourself(Result *this)

{
  bool bVar1;
  reference pCVar2;
  ostream *poVar3;
  undefined1 local_48 [8];
  Core core;
  iterator __end1;
  iterator __begin1;
  vector<Core,_std::allocator<Core>_> *__range1;
  Result *this_local;
  
  __end1 = std::vector<Core,_std::allocator<Core>_>::begin(&this->Cores);
  core.MyTasks.super__Vector_base<Task,_std::allocator<Task>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)std::vector<Core,_std::allocator<Core>_>::end(&this->Cores);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Core_*,_std::vector<Core,_std::allocator<Core>_>_>
                                *)&core.MyTasks.super__Vector_base<Task,_std::allocator<Task>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    pCVar2 = __gnu_cxx::__normal_iterator<Core_*,_std::vector<Core,_std::allocator<Core>_>_>::
             operator*(&__end1);
    Core::Core((Core *)local_48,pCVar2);
    Core::showyourself((Core *)local_48);
    Core::~Core((Core *)local_48);
    __gnu_cxx::__normal_iterator<Core_*,_std::vector<Core,_std::allocator<Core>_>_>::operator++
              (&__end1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Total time: ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->longestProcessingTime);
  std::operator<<(poVar3,"\n");
  return;
}

Assistant:

void Result::showyourself(){
	for (auto core : Cores)
		core.showyourself();
	std::cout<<"Total time: "<<longestProcessingTime<<"\n";
}